

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SwitchArg.h
# Opt level: O3

bool __thiscall
TCLAP::SwitchArg::processArg
          (SwitchArg *this,int *i,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pbVar1;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  CmdLineParseException *this_00;
  uint uVar5;
  ulong uVar6;
  string local_60;
  string local_40;
  
  if (((this->super_Arg)._ignoreable != true) || (Arg::ignoreRestRef()::ign == '\0')) {
    iVar4 = (*(this->super_Arg)._vptr_Arg[6])
                      (this,(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + *i);
    if ((char)iVar4 != '\0') {
      commonProcessing(this);
      return true;
    }
    bVar3 = combinedSwitchesMatch
                      (this,(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + *i);
    if (bVar3) {
      bVar3 = combinedSwitchesMatch
                        (this,(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + *i);
      if (bVar3) {
        this_00 = (CmdLineParseException *)__cxa_allocate_exception(0x68);
        local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_60,"Argument already set!","");
        (*(this->super_Arg)._vptr_Arg[7])(&local_40,this);
        CmdLineParseException::CmdLineParseException(this_00,&local_60,&local_40);
        __cxa_throw(this_00,&CmdLineParseException::typeinfo,ArgException::~ArgException);
      }
      commonProcessing(this);
      pbVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar2 = pbVar1[*i]._M_string_length;
      if (uVar2 < 2) {
        return true;
      }
      uVar6 = 1;
      uVar5 = 2;
      do {
        bVar3 = pbVar1[*i]._M_dataplus._M_p[uVar6] == '\a';
        if (!bVar3) {
          return bVar3;
        }
        uVar6 = (ulong)uVar5;
        uVar5 = uVar5 + 1;
      } while (uVar6 < uVar2);
      return bVar3;
    }
  }
  return false;
}

Assistant:

inline bool SwitchArg::processArg(int *i, std::vector<std::string>& args)
{
  if ( _ignoreable && Arg::ignoreRest() )
    return false;

  // if the whole string matches the flag or name string
  if ( argMatches( args[*i] ) )
    {
      commonProcessing();

      return true;
    }
  // if a substring matches the flag as part of a combination
  else if ( combinedSwitchesMatch( args[*i] ) )
    {
      // check again to ensure we don't misinterpret 
      // this as a MultiSwitchArg 
      if ( combinedSwitchesMatch( args[*i] ) )
	throw(CmdLineParseException("Argument already set!", 
				    toString()));

      commonProcessing();

      // We only want to return true if we've found the last combined
      // match in the string, otherwise we return true so that other 
      // switches in the combination will have a chance to match.
      return lastCombined( args[*i] );
    }
  else
    return false;
}